

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

pool_ptr<soul::AST::Statement> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::Statement>
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Statement> *o)

{
  bool bVar1;
  Statement *pSVar2;
  pool_ptr<soul::AST::Statement> *in_RDX;
  pool_ptr<soul::AST::Statement> local_28 [2];
  pool_ptr<soul::AST::Statement> *o_local;
  RewritingASTVisitor *this_local;
  
  o_local = o;
  this_local = this;
  bVar1 = pool_ptr<soul::AST::Statement>::operator==(in_RDX,(void *)0x0);
  if (bVar1) {
    pool_ptr<soul::AST::Statement>::pool_ptr((pool_ptr<soul::AST::Statement> *)this);
  }
  else {
    local_28[0].object = in_RDX->object;
    bVar1 = is_type<soul::AST::Statement,soul::AST::Statement>(local_28);
    checkAssertion(bVar1,"is_type<Type> (o)","visitAs",0x1cd);
    pool_ptr<soul::AST::Statement>::~pool_ptr(local_28);
    pSVar2 = pool_ptr<soul::AST::Statement>::operator*(in_RDX);
    pSVar2 = visitObject((RewritingASTVisitor *)o,pSVar2);
    pool_ptr<soul::AST::Statement>::pool_ptr<soul::AST::Statement,void>
              ((pool_ptr<soul::AST::Statement> *)this,pSVar2);
  }
  return (pool_ptr<soul::AST::Statement>)(Statement *)this;
}

Assistant:

pool_ptr<Type> visitAs (pool_ptr<Type> o)
    {
        if (o == nullptr)
            return {};

        SOUL_ASSERT (is_type<Type> (o));
        return static_cast<Type&> (visitObject (*o));
    }